

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O1

bool __thiscall CEntity::GameLayerClipped(CEntity *this,vec2 CheckPos)

{
  CGameContext *pCVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  
  uVar7 = -(uint)(0.0 < CheckPos.field_0.x);
  iVar4 = (int)((float)(~uVar7 & 0xbf000000 | uVar7 & 0x3f000000) + CheckPos.field_0.x);
  uVar7 = -(uint)(0.0 < CheckPos.field_1.y);
  iVar5 = (int)((float)(~uVar7 & 0xbf000000 | uVar7 & 0x3f000000) + CheckPos.field_1.y);
  iVar3 = iVar5 + 0x1f;
  if (-1 < iVar5) {
    iVar3 = iVar5;
  }
  bVar2 = true;
  if (-0x1920 < iVar4) {
    iVar6 = iVar4 + 0x1f;
    if (-1 < iVar4) {
      iVar6 = iVar4;
    }
    if ((-0x1920 < iVar5) &&
       (pCVar1 = this->m_pGameWorld->m_pGameServer, iVar6 >> 5 < (pCVar1->m_Collision).m_Width + 200
       )) {
      bVar2 = (pCVar1->m_Collision).m_Height + 200 <= iVar3 >> 5;
    }
  }
  return bVar2;
}

Assistant:

bool CEntity::GameLayerClipped(vec2 CheckPos)
{
	int rx = round_to_int(CheckPos.x) / 32;
	int ry = round_to_int(CheckPos.y) / 32;
	return (rx < -200 || rx >= GameServer()->Collision()->GetWidth()+200)
			|| (ry < -200 || ry >= GameServer()->Collision()->GetHeight()+200);
}